

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_save.cpp
# Opt level: O2

void save_string_proc(ostream *os,Am_Load_Save_Context *context,Am_Value *value)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  Am_String string;
  Am_String AStack_28;
  
  Am_Load_Save_Context::Save_Type_Name(context,os,"Am_STRING");
  Am_String::Am_String(&AStack_28,value);
  __s = Am_String::operator_cast_to_char_(&AStack_28);
  sVar1 = strlen(__s);
  poVar2 = (ostream *)std::ostream::operator<<(os,(int)sVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar3 = 0;
  uVar4 = sVar1 & 0xffffffff;
  if ((int)sVar1 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    std::operator<<(os,__s[uVar3]);
  }
  std::endl<char,std::char_traits<char>>(os);
  Am_String::~Am_String(&AStack_28);
  return;
}

Assistant:

Am_Define_Method(Am_Save_Method, void, save_string,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Value &value))
{
  context.Save_Type_Name(os, "Am_STRING");
  Am_String string = value;
  const char *string_val = string;
  int length = strlen(string_val);
  os << length << std::endl;
  int i;
  for (i = 0; i < length; ++i) {
    os << string_val[i];
  }
  os << std::endl;
}